

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsStartNow(Curl_easy *data)

{
  timeval tVar1;
  __time_t local_20;
  __suseconds_t local_18;
  Curl_easy *data_local;
  
  (data->progress).speeder_c = 0;
  tVar1 = curlx_tvnow();
  local_20 = tVar1.tv_sec;
  (data->progress).start.tv_sec = local_20;
  local_18 = tVar1.tv_usec;
  (data->progress).start.tv_usec = local_18;
  (data->progress).ul_limit_start.tv_sec = 0;
  (data->progress).ul_limit_start.tv_usec = 0;
  (data->progress).dl_limit_start.tv_sec = 0;
  (data->progress).dl_limit_start.tv_usec = 0;
  (data->progress).flags = (data->progress).flags & 0x90;
  return;
}

Assistant:

void Curl_pgrsStartNow(struct Curl_easy *data)
{
  data->progress.speeder_c = 0; /* reset the progress meter display */
  data->progress.start = Curl_tvnow();
  data->progress.ul_limit_start.tv_sec = 0;
  data->progress.ul_limit_start.tv_usec = 0;
  data->progress.dl_limit_start.tv_sec = 0;
  data->progress.dl_limit_start.tv_usec = 0;
  /* clear all bits except HIDE and HEADERS_OUT */
  data->progress.flags &= PGRS_HIDE|PGRS_HEADERS_OUT;
}